

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest::CheckOffsetPastEndReturnsNoRecords(LogTest *this,uint64_t offset_past_end)

{
  bool bVar1;
  Reader *this_00;
  size_t sVar2;
  char *message;
  char *in_R9;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  string scratch;
  Slice record;
  Reader *offset_reader;
  size_t local_20;
  uint64_t local_18;
  uint64_t offset_past_end_local;
  LogTest *this_local;
  
  local_18 = offset_past_end;
  offset_past_end_local = (uint64_t)this;
  WriteInitialOffsetLog(this);
  this->reading_ = true;
  Slice::Slice((Slice *)&offset_reader,&(this->dest_).contents_);
  (this->source_).contents_.data_ = (char *)offset_reader;
  (this->source_).contents_.size_ = local_20;
  this_00 = (Reader *)operator_new(0x58);
  sVar2 = WrittenBytes(this);
  Reader::Reader(this_00,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 sVar2 + local_18);
  Slice::Slice((Slice *)((long)&scratch.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  bVar1 = Reader::ReadRecord(this_00,(Slice *)((long)&scratch.field_2 + 8),
                             (string *)&gtest_ar_.message_);
  local_71 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_70,
               (AssertionResult *)"!offset_reader->ReadRecord(&record, &scratch)","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x85,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if ((bVar1) && (this_00 != (Reader *)0x0)) {
    Reader::~Reader(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

void CheckOffsetPastEndReturnsNoRecords(uint64_t offset_past_end) {
    WriteInitialOffsetLog();
    reading_ = true;
    source_.contents_ = Slice(dest_.contents_);
    Reader* offset_reader = new Reader(&source_, &report_, true /*checksum*/,
                                       WrittenBytes() + offset_past_end);
    Slice record;
    std::string scratch;
    ASSERT_TRUE(!offset_reader->ReadRecord(&record, &scratch));
    delete offset_reader;
  }